

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O3

result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
* __thiscall
toml::detail::
sequence<toml::detail::repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>>,toml::detail::unlimited>,toml::detail::character<(char)39>>
::invoke<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          sequence<toml::detail::repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>>,toml::detail::unlimited>,toml::detail::character<(char)39>>
          *this,location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *loc,
          region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *reg,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               first)

{
  size_type *psVar1;
  value_type *other;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  rslt;
  undefined1 local_c0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_90;
  const_iterator cStack_80;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_78;
  
  repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>>,toml::detail::unlimited>
  ::invoke<std::__cxx11::string>
            (&local_78,
             (repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>>,toml::detail::unlimited>
              *)this,loc);
  if (local_78.is_ok_ == false) {
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)this,(const_iterator)reg);
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    other = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
            ::unwrap(&local_78);
    region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator+=((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)loc,other);
    local_c0._24_8_ = local_c0 + 0x28;
    local_c0._0_8_ = &PTR__region_0015dc50;
    local_c0._8_8_ =
         (loc->source_).
         super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_c0._16_8_ =
         (loc->source_).
         super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    (loc->source_).
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (loc->source_).
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    psVar1 = &(loc->source_name_)._M_string_length;
    if ((size_type *)loc->line_number_ == psVar1) {
      local_c0._40_8_ = *psVar1;
      aStack_90._M_allocated_capacity = (loc->source_name_).field_2._M_allocated_capacity;
    }
    else {
      local_c0._40_8_ = *psVar1;
      local_c0._24_8_ = (pointer)loc->line_number_;
    }
    local_c0._32_8_ = (loc->source_name_)._M_dataplus._M_p;
    loc->line_number_ = (size_t)psVar1;
    (loc->source_name_)._M_dataplus._M_p = (pointer)0x0;
    *(undefined1 *)&(loc->source_name_)._M_string_length = 0;
    aStack_90._8_8_ = *(undefined8 *)((long)&(loc->source_name_).field_2 + 8);
    cStack_80._M_current = (loc->iter_)._M_current;
    sequence<toml::detail::character<(char)39>>::
    invoke<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (__return_storage_ptr__,(sequence<toml::detail::character<(char)39>> *)this,
               (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c0,reg,first);
    region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~region((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_c0);
  }
  if (local_78.is_ok_ == true) {
    region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~region(&local_78.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc, region<Cont> reg, Iterator first)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        reg += rslt.unwrap(); // concat regions
        return sequence<Tail...>::invoke(loc, std::move(reg), first);
    }